

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O3

REF_STATUS
ref_mpi_balance(REF_MPI ref_mpi,REF_INT ldim,REF_INT nitem,void *items,REF_INT first_rank,
               REF_INT last_rank,REF_INT *nbalanced,void **balanced,REF_TYPE type)

{
  int *piVar1;
  int iVar2;
  REF_MPI pRVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  REF_INT *proc;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  REF_STATUS RVar11;
  ulong uVar12;
  REF_INT RVar13;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  uint uVar17;
  int nsend;
  int iVar18;
  ulong uVar19;
  REF_INT total;
  int *local_68;
  ulong local_60;
  REF_MPI local_58;
  uint local_50;
  uint local_4c;
  size_t local_48;
  ulong local_40;
  void *local_38;
  
  total = nitem;
  local_58 = ref_mpi;
  uVar4 = ref_mpi_allsum(ref_mpi,&total,1,1);
  if (uVar4 != 0) {
    pcVar16 = "total items";
    uVar7 = 0x4aa;
LAB_0020916d:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar7,
           "ref_mpi_balance",(ulong)uVar4,pcVar16);
    return uVar4;
  }
  uVar17 = (last_rank - first_rank) + 1;
  iVar2 = local_58->id;
  uVar8 = 0;
  uVar19 = 0;
  if (iVar2 <= last_rank && first_rank <= iVar2) {
    uVar8 = (long)total % (long)(int)uVar17 & 0xffffffff;
    iVar18 = 0;
    if (0 < iVar2 - first_rank) {
      iVar18 = iVar2 - first_rank;
    }
    uVar19 = (ulong)((uint)(iVar18 < (int)((long)total % (long)(int)uVar17)) + total / (int)uVar17);
  }
  iVar18 = (int)uVar19;
  *nbalanced = iVar18;
  iVar2 = local_58->n;
  uVar12 = (ulong)iVar2;
  local_60 = (ulong)(uint)nitem;
  local_50 = first_rank;
  local_4c = last_rank;
  local_38 = items;
  if ((long)uVar12 < 0) {
    pcVar16 = "malloc haves of REF_INT negative";
    uVar7 = 0x4b8;
LAB_002092e8:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar7,
           "ref_mpi_balance",pcVar16);
LAB_002092ef:
    RVar11 = 1;
  }
  else {
    local_40 = uVar8;
    piVar6 = (int *)malloc(uVar12 * 4);
    if (piVar6 == (int *)0x0) {
      pcVar16 = "malloc haves of REF_INT NULL";
      uVar7 = 0x4b8;
    }
    else {
      local_68 = piVar6;
      piVar6 = (int *)malloc(uVar12 * 4);
      if (piVar6 == (int *)0x0) {
        pcVar16 = "malloc shares of REF_INT NULL";
        uVar7 = 0x4b9;
      }
      else {
        *piVar6 = iVar18;
        nsend = (int)local_60;
        *local_68 = nsend;
        if (nsend < 0) {
          pcVar16 = "malloc destination of REF_INT negative";
          uVar7 = 0x4bd;
          goto LAB_002092e8;
        }
        uVar8 = local_60 & 0xffffffff;
        local_48 = uVar8 * 4;
        proc = (REF_INT *)malloc(local_48);
        if (proc != (REF_INT *)0x0) {
          if (nsend != 0) {
            memset(proc,0,local_48);
            nsend = (int)local_60;
          }
          pRVar3 = local_58;
          iVar5 = 0;
          if (0 < (long)local_58->id) {
            lVar9 = 0;
            iVar5 = 0;
            do {
              iVar5 = iVar5 + local_68[lVar9];
              lVar9 = lVar9 + 1;
            } while (local_58->id != lVar9);
          }
          if (nsend != 0) {
            uVar10 = 0;
            do {
              if (iVar2 == 0) {
                RVar13 = -1;
              }
              else {
                uVar14 = 0;
                iVar15 = (int)uVar10 + iVar5;
                do {
                  piVar1 = piVar6 + uVar14;
                  if (iVar15 < *piVar1) goto LAB_002093da;
                  uVar14 = uVar14 + 1;
                  iVar15 = iVar15 - *piVar1;
                } while (uVar12 != uVar14);
                uVar14 = (ulong)(iVar2 - 1);
LAB_002093da:
                RVar13 = (REF_INT)uVar14;
              }
              proc[uVar10] = RVar13;
              uVar10 = uVar10 + 1;
            } while (uVar10 != uVar8);
          }
          uVar4 = ref_mpi_blindsend(local_58,proc,local_38,ldim,nsend,balanced,nbalanced,type);
          if (uVar4 != 0) {
            pcVar16 = "blind send node";
            uVar7 = 0x4c8;
            goto LAB_0020916d;
          }
          if (iVar18 == *nbalanced) {
            free(proc);
            free(piVar6);
            free(local_68);
            return 0;
          }
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                 0x4d1,"ref_mpi_balance","share mismatch",(long)iVar18,(long)*nbalanced);
          printf("rank %d first %d last %d active %d total %d rem %d share %d nitem %d\n",
                 (ulong)(uint)pRVar3->id,(ulong)local_50,(ulong)local_4c,(ulong)uVar17,
                 (ulong)(uint)total,local_40,uVar19,local_60);
          if (0 < pRVar3->n) {
            lVar9 = 0;
            do {
              printf(" %d",(ulong)(uint)piVar6[lVar9]);
              lVar9 = lVar9 + 1;
            } while (lVar9 < pRVar3->n);
          }
          putchar(10);
          goto LAB_002092ef;
        }
        pcVar16 = "malloc destination of REF_INT NULL";
        uVar7 = 0x4bd;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar7,
           "ref_mpi_balance",pcVar16);
    RVar11 = 2;
  }
  return RVar11;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_balance(REF_MPI ref_mpi, REF_INT ldim, REF_INT nitem,
                                   void *items, REF_INT first_rank,
                                   REF_INT last_rank, REF_INT *nbalanced,
                                   void **balanced, REF_TYPE type) {
  REF_INT *shares, total, share, remainder;
  REF_INT *haves;
  REF_INT *destination, offset, part, i;
  REF_INT active;

  active = last_rank - first_rank + 1;

  total = nitem;
  RSS(ref_mpi_allsum(ref_mpi, &total, 1, REF_INT_TYPE), "total items");
  if (first_rank <= ref_mpi_rank(ref_mpi) &&
      ref_mpi_rank(ref_mpi) <= last_rank) {
    share = total / active;
    remainder = total - share * active;
  } else {
    share = 0;
    remainder = 0;
  }
  if (MAX(0, ref_mpi_rank(ref_mpi) - first_rank) < remainder) {
    share++;
  }
  *nbalanced = share;

  ref_malloc(haves, ref_mpi_n(ref_mpi), REF_INT);
  ref_malloc(shares, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &share, shares, REF_INT_TYPE), "all share");
  RSS(ref_mpi_allgather(ref_mpi, &nitem, haves, REF_INT_TYPE), "all share");

  ref_malloc_init(destination, nitem, REF_INT, 0);
  offset = 0;
  for (part = 0; part < ref_mpi_rank(ref_mpi); part++) {
    offset += haves[part];
  }
  for (i = 0; i < nitem; i++) {
    destination[i] = find_destination(ref_mpi_n(ref_mpi), shares, offset + i);
  }

  RSS(ref_mpi_blindsend(ref_mpi, destination, items, ldim, nitem, balanced,
                        nbalanced, type),
      "blind send node");
  REIB(share, *nbalanced, "share mismatch", {
    printf(
        "rank %d first %d last %d active %d total %d rem %d share %d nitem "
        "%d\n",
        ref_mpi_rank(ref_mpi), first_rank, last_rank, active, total, remainder,
        share, nitem);
    for (i = 0; i < ref_mpi_n(ref_mpi); i++) printf(" %d", shares[i]);
    printf("\n");
  });

  ref_free(destination);
  ref_free(shares);
  ref_free(haves);

  return REF_SUCCESS;
}